

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_std.cc
# Opt level: O0

bool __thiscall benchmark::Regex::Init(Regex *this,string *spec,string *error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_RSI;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_RDI;
  regex_error *e;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffffb0;
  flag_type in_stack_ffffffffffffffe4;
  
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>(in_RSI,in_RDX,in_stack_ffffffffffffffe4);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
            (in_stack_ffffffffffffffb0,in_RDI);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (in_stack_ffffffffffffffb0);
  *(undefined1 *)&in_RDI->_M_flags = 1;
  return (bool)((char)in_RDI->_M_flags & 1);
}

Assistant:

bool Regex::Init(const std::string& spec, std::string* error) {
  try {
    re_ = std::regex(spec, std::regex_constants::extended);

    init_ = true;
  } catch (const std::regex_error& e) {
    if (error) {
      *error = e.what();
    }
  }
  return init_;
}